

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_shader.h
# Opt level: O2

GLuint s_loadShader(GLenum type,char *source)

{
  GLint GVar1;
  GLuint GVar2;
  GLchar *__ptr;
  char *source_local;
  GLint infoLen;
  GLint compiled;
  
  source_local = source;
  GVar2 = (*glad_glCreateShader)(type);
  if (GVar2 == 0) {
    fwrite("Could not create shader!\n",0x19,1,_stderr);
  }
  else {
    (*glad_glShaderSource)(GVar2,1,&source_local,(GLint *)0x0);
    (*glad_glCompileShader)(GVar2);
    (*glad_glGetShaderiv)(GVar2,0x8b81,&compiled);
    if (compiled != 0) {
      return GVar2;
    }
    fwrite("Could not compile shader!\n",0x1a,1,_stderr);
    infoLen = 0;
    (*glad_glGetShaderiv)(GVar2,0x8b84,&infoLen);
    GVar1 = infoLen;
    if ((long)infoLen != 0) {
      __ptr = (GLchar *)malloc((long)infoLen);
      (*glad_glGetShaderInfoLog)(GVar2,GVar1,(GLsizei *)0x0,__ptr);
      fprintf(_stderr,"%s\n",__ptr);
      free(__ptr);
    }
    (*glad_glDeleteShader)(GVar2);
  }
  return 0;
}

Assistant:

static GLuint s_loadShader(GLenum type, const char *source)
{
	GLuint shader = glCreateShader(type);
	if (shader == 0)
	{
		fprintf(stderr, "Could not create shader!\n");
		return 0;
	}
	glShaderSource(shader, 1, &source, NULL);
	glCompileShader(shader);
	GLint compiled;
	glGetShaderiv(shader, GL_COMPILE_STATUS, &compiled);
	if (!compiled)
	{
		fprintf(stderr, "Could not compile shader!\n");
		GLint infoLen = 0;
		glGetShaderiv(shader, GL_INFO_LOG_LENGTH, &infoLen);
		if (infoLen)
		{
			char* infoLog = (char*)malloc(infoLen);
			glGetShaderInfoLog(shader, infoLen, NULL, infoLog);
			fprintf(stderr, "%s\n", infoLog);
			free(infoLog);
		}
		glDeleteShader(shader);
		return 0;
	}
	return shader;
}